

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsTraceExternalReference(JsRuntimeHandle runtimeHandle,JsValueRef value)

{
  ThreadContext *threadContext;
  JsErrorCode JVar1;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_58 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_30;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar1 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    threadContext = *runtimeHandle;
    ThreadContextScope::ThreadContextScope(&local_30,threadContext);
    JVar1 = JsErrorWrongThread;
    if (local_30.isValid == true) {
      JVar1 = JsNoError;
      Memory::Recycler::TryExternalMarkNonInterior(threadContext->recycler,value);
    }
    ThreadContextScope::~ThreadContextScope(&local_30);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  return JVar1;
}

Assistant:

CHAKRA_API JsTraceExternalReference(_In_ JsRuntimeHandle runtimeHandle, _In_ JsValueRef value)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        recycler->TryExternalMarkNonInterior(value);
        return JsNoError;
    });
}